

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.cpp
# Opt level: O1

int Am_Fill_To_Right_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Object owner;
  Am_Object AStack_28;
  
  iVar2 = 0;
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)self,10);
  bVar1 = Am_Object::Valid(&AStack_28);
  if (bVar1) {
    pAVar5 = Am_Object::Get(&AStack_28,0x66,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    pAVar5 = Am_Object::Get(self,100,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar5);
    pAVar5 = Am_Object::Get(&AStack_28,0xa0,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar5);
    iVar2 = iVar2 - (iVar3 + iVar4);
  }
  Am_Object::~Am_Object(&AStack_28);
  return iVar2;
}

Assistant:

Am_Define_Formula(int, Am_Fill_To_Right)
{
  Am_Object owner = self.Get_Owner();
  if (!owner.Valid())
    return 0;
  return (int)(owner.Get(Am_WIDTH)) - (int)(self.Get(Am_LEFT)) -
         (int)(owner.Get(Am_RIGHT_OFFSET));
}